

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_comparison_join.cpp
# Opt level: O0

void __thiscall
duckdb::PhysicalComparisonJoin::PhysicalComparisonJoin
          (PhysicalComparisonJoin *this,LogicalOperator *op,PhysicalOperatorType type,
          vector<duckdb::JoinCondition,_true> *conditions_p,JoinType join_type,
          idx_t estimated_cardinality)

{
  vector<duckdb::JoinCondition,_true> *in_RCX;
  undefined1 in_DL;
  PhysicalJoin *in_RSI;
  undefined8 *in_RDI;
  undefined1 in_R8B;
  vector<duckdb::JoinCondition,_true> *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe8;
  
  PhysicalJoin::PhysicalJoin
            (in_RSI,(LogicalOperator *)CONCAT17(in_DL,in_stack_ffffffffffffffe8),
             (PhysicalOperatorType)((ulong)in_RCX >> 0x38),(JoinType)((ulong)in_RCX >> 0x30),
             CONCAT17(in_R8B,in_stack_ffffffffffffffd8));
  *in_RDI = &PTR__PhysicalComparisonJoin_0352c3c8;
  vector<duckdb::JoinCondition,_true>::vector(in_RCX,in_stack_ffffffffffffff98);
  unique_ptr<duckdb::JoinFilterPushdownInfo,_std::default_delete<duckdb::JoinFilterPushdownInfo>,_true>
  ::unique_ptr((unique_ptr<duckdb::JoinFilterPushdownInfo,_std::default_delete<duckdb::JoinFilterPushdownInfo>,_true>
                *)0x17fcdba);
  ReorderConditions((vector<duckdb::JoinCondition,_true> *)this);
  return;
}

Assistant:

PhysicalComparisonJoin::PhysicalComparisonJoin(LogicalOperator &op, PhysicalOperatorType type,
                                               vector<JoinCondition> conditions_p, JoinType join_type,
                                               idx_t estimated_cardinality)
    : PhysicalJoin(op, type, join_type, estimated_cardinality), conditions(std::move(conditions_p)) {
	ReorderConditions(conditions);
}